

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O3

bool peparse::readDword(bounded_buffer *b,uint32_t offset,uint32_t *out)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  long *local_50;
  long local_40;
  long lStack_38;
  string local_30;
  
  if (b == (bounded_buffer *)0x0) {
    err = 10;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120014);
    to_string<unsigned_int>(&local_30,0x80,f);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x120009);
    local_50 = &local_40;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar2[3];
    }
    else {
      local_40 = *plVar4;
      local_50 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_50);
  }
  else {
    if ((ulong)offset + 3 < (ulong)b->bufLen) {
      uVar1 = *(uint *)(b->buf + offset);
      uVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (b->swapBytes == false) {
        uVar3 = uVar1;
      }
      *out = uVar3;
      return true;
    }
    err = 0xb;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001277f0,0x120014);
    to_string<unsigned_int>(&local_30,0x85,f_00);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x120009);
    local_50 = &local_40;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar2[3];
    }
    else {
      local_40 = *plVar4;
      local_50 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,(ulong)local_50);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool readDword(bounded_buffer *b, std::uint32_t offset, std::uint32_t &out) {
  if (b == nullptr) {
    PE_ERR(PEERR_BUFFER);
    return false;
  }

  if (static_cast<std::uint64_t>(offset) + 3 >= b->bufLen) {
    PE_ERR(PEERR_ADDRESS);
    return false;
  }

  std::uint32_t tmp;
  memcpy(&tmp, (b->buf + offset), sizeof(std::uint32_t));
  if (b->swapBytes) {
    out = byteSwapUint32(tmp);
  } else {
    out = tmp;
  }

  return true;
}